

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CurrentGenerator.cpp
# Opt level: O0

void __thiscall
CurrentGenerator::CurrentGenerator(CurrentGenerator *this,CurrentGenerator_param *param)

{
  Logging *__mean;
  duration this_00;
  result_type __s;
  long in_RSI;
  Neuron *in_RDI;
  uint seed;
  Neuron *in_stack_ffffffffffffff90;
  Logging *local_58;
  _func_int **local_50;
  long local_48;
  undefined1 local_40;
  undefined8 local_38;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_30;
  duration<long,_std::ratio<1L,_1000000000L>_> local_28;
  undefined4 local_20;
  long local_10;
  
  local_10 = in_RSI;
  Neuron::Neuron(in_RDI);
  in_RDI->_vptr_Neuron = (_func_int **)&PTR_update_00127af8;
  in_RDI[1].populationID = local_10;
  std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>::
  linear_congruential_engine
            ((linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)0x11844e);
  std::normal_distribution<double>::normal_distribution((normal_distribution<double> *)0x11845e);
  __mean = (Logging *)Clock::getInstance();
  in_RDI[2].logger = __mean;
  Neuron::initialize(in_stack_ffffffffffffff90);
  local_30.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  this_00 = std::chrono::
            time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
            ::time_since_epoch(&local_30);
  local_28.__r = this_00.__r;
  __s = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count(&local_28);
  local_20 = (undefined4)__s;
  std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>::
  linear_congruential_engine
            ((linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)this_00.__r,
             __s);
  *(undefined8 *)&in_RDI[1].neuronID = local_38;
  std::normal_distribution<double>::normal_distribution
            ((normal_distribution<double> *)in_RDI,(result_type_conflict)__mean,
             (result_type_conflict)this_00.__r);
  in_RDI[1].logger = local_58;
  in_RDI[2]._vptr_Neuron = local_50;
  in_RDI[2].populationID = local_48;
  *(undefined1 *)&in_RDI[2].neuronID = local_40;
  return;
}

Assistant:

CurrentGenerator::CurrentGenerator(CurrentGenerator_param* param) : param(param) {
    clock = Clock::getInstance();
    initialize();
    unsigned seed = std::chrono::system_clock::now().time_since_epoch().count();
    generator = std::default_random_engine(seed);
    distribution = std::normal_distribution<double>(param->noiseMean, param->noiseStd);
}